

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable.h
# Opt level: O2

bool __thiscall rotate_y::hit(rotate_y *this,ray *r,double t_min,double t_max,hit_record *rec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  vec3 local_68;
  ray local_50;
  
  dVar1 = (r->orig).e[0];
  local_50.orig.e[1] = (r->orig).e[1];
  local_50.dir.e[1] = (r->dir).e[1];
  dVar2 = (r->orig).e[2];
  dVar3 = (r->dir).e[0];
  dVar4 = (r->dir).e[2];
  local_50.tm = r->tm;
  dVar5 = this->sin_theta;
  dVar6 = this->cos_theta;
  local_50.orig.e[0] = dVar6 * dVar1 - dVar2 * dVar5;
  local_50.orig.e[2] = dVar1 * dVar5 + dVar6 * dVar2;
  local_50.dir.e[0] = dVar3 * dVar6 + -dVar5 * dVar4;
  local_50.dir.e[2] = dVar5 * dVar3 + dVar6 * dVar4;
  iVar7 = (**((this->ptr).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_hittable)(SUB84(t_min,0));
  if (SUB41(iVar7,0) != false) {
    local_68.e[1] = (rec->normal).e[1];
    dVar1 = this->sin_theta;
    dVar2 = this->cos_theta;
    dVar3 = (rec->p).e[0];
    dVar4 = (rec->p).e[2];
    dVar5 = (rec->normal).e[0];
    dVar6 = (rec->normal).e[2];
    local_68.e[0] = dVar2 * dVar5 + dVar1 * dVar6;
    local_68.e[2] = dVar2 * dVar6 - dVar1 * dVar5;
    (rec->p).e[0] = dVar2 * dVar3 + dVar1 * dVar4;
    (rec->p).e[2] = dVar4 * dVar2 - dVar3 * dVar1;
    hit_record::set_face_normal(rec,&local_50,&local_68);
  }
  return SUB41(iVar7,0);
}

Assistant:

bool rotate_y::hit(const ray& r, double t_min, double t_max, hit_record& rec) const {
    vec3 origin = r.origin();
    vec3 direction = r.direction();

    origin[0] = cos_theta*r.origin()[0] - sin_theta*r.origin()[2];
    origin[2] = sin_theta*r.origin()[0] + cos_theta*r.origin()[2];

    direction[0] = cos_theta*r.direction()[0] - sin_theta*r.direction()[2];
    direction[2] = sin_theta*r.direction()[0] + cos_theta*r.direction()[2];

    ray rotated_r(origin, direction, r.time());

    if (!ptr->hit(rotated_r, t_min, t_max, rec))
        return false;

    vec3 p = rec.p;
    vec3 normal = rec.normal;

    p[0] =  cos_theta*rec.p[0] + sin_theta*rec.p[2];
    p[2] = -sin_theta*rec.p[0] + cos_theta*rec.p[2];

    normal[0] =  cos_theta*rec.normal[0] + sin_theta*rec.normal[2];
    normal[2] = -sin_theta*rec.normal[0] + cos_theta*rec.normal[2];

    rec.p = p;
    rec.set_face_normal(rotated_r, normal);

    return true;
}